

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O3

void * coll_seq_remove_first(coll_seq_t *seq)

{
  coll_seq_node_t *__ptr;
  coll_seq_node_t *pcVar1;
  void *pvVar2;
  
  if ((seq == (coll_seq_t *)0x0) || (seq->len == 0)) {
    pvVar2 = (void *)0x0;
  }
  else {
    __ptr = seq->head;
    pvVar2 = __ptr->data;
    pcVar1 = __ptr->next;
    free(__ptr);
    seq->head = pcVar1;
    seq->len = seq->len - 1;
  }
  return pvVar2;
}

Assistant:

void *coll_seq_remove_first(coll_seq_t *seq) {
    if (!seq || seq->len == 0) {
        return NULL;
    }
    void *data = seq->head->data;
    node_t *next = seq->head->next;
    free(seq->head);
    seq->head = next;
    --(seq->len);
    return data;
}